

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<short,duckdb::QuantileStandardType>,short,duckdb::QuantileListOperation<short,false>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  short sVar1;
  FunctionData *pFVar2;
  iterator iVar3;
  UnifiedVectorFormat *pUVar4;
  ulong uVar5;
  ulong uVar6;
  UnifiedVectorFormat *pUVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  AggregateUnaryInput input_data;
  short local_a2;
  UnifiedVectorFormat *local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  Vector *local_80;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a0 = (UnifiedVectorFormat *)count;
  if (*input == (Vector)0x0) {
    lVar9 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < (long)local_a0 + 0x3fU) {
      local_88 = (long)local_a0 + 0x3fU >> 6;
      uVar6 = 0;
      uVar10 = 0;
      local_90 = lVar9;
      local_80 = input;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = *(ulong *)(*(long *)(input + 0x28) + uVar6 * 8);
        }
        pUVar7 = (UnifiedVectorFormat *)(uVar10 + 0x40);
        if (local_a0 <= uVar10 + 0x40) {
          pUVar7 = local_a0;
        }
        uVar8 = (ulong)pUVar7;
        if (uVar5 != 0) {
          uVar8 = uVar10;
          local_98 = uVar6;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar10 < pUVar7) {
              do {
                sVar1 = *(short *)(lVar9 + uVar10 * 2);
                local_78.input = (AggregateInputData *)CONCAT62(local_78.input._2_6_,sVar1);
                iVar3._M_current = *(short **)(state + 8);
                if (iVar3._M_current == *(short **)(state + 0x10)) {
                  std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                            ((vector<short,_std::allocator<short>_> *)state,iVar3,(short *)&local_78
                            );
                }
                else {
                  *iVar3._M_current = sVar1;
                  *(short **)(state + 8) = iVar3._M_current + 1;
                }
                uVar10 = uVar10 + 1;
                uVar8 = uVar10;
              } while (pUVar7 != (UnifiedVectorFormat *)uVar10);
            }
          }
          else {
            lVar9 = local_90;
            if (uVar10 < pUVar7) {
              lVar9 = local_90 + uVar10 * 2;
              uVar8 = 0;
              do {
                if ((uVar5 >> (uVar8 & 0x3f) & 1) != 0) {
                  sVar1 = *(short *)(lVar9 + uVar8 * 2);
                  local_78.input = (AggregateInputData *)CONCAT62(local_78.input._2_6_,sVar1);
                  iVar3._M_current = *(short **)(state + 8);
                  if (iVar3._M_current == *(short **)(state + 0x10)) {
                    std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                              ((vector<short,_std::allocator<short>_> *)state,iVar3,
                               (short *)&local_78);
                  }
                  else {
                    *iVar3._M_current = sVar1;
                    *(short **)(state + 8) = iVar3._M_current + 1;
                  }
                }
                uVar8 = uVar8 + 1;
              } while ((uVar10 - (long)pUVar7) + uVar8 != 0);
              uVar6 = local_98;
              input = local_80;
              lVar9 = local_90;
              uVar8 = uVar10 + uVar8;
            }
          }
        }
        uVar6 = uVar6 + 1;
        uVar10 = uVar8;
      } while (uVar6 != local_88);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      QuantileOperation::
      ConstantOperation<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<short,false>>
                ((QuantileState<short,_duckdb::QuantileStandardType> *)state,
                 *(short **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,local_a0);
    if (local_78.input_idx == 0) {
      if (local_a0 != (UnifiedVectorFormat *)0x0) {
        pFVar2 = ((local_78.input)->bind_data).ptr;
        pUVar7 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar4 = pUVar7;
          if (pFVar2 != (FunctionData *)0x0) {
            pUVar4 = (UnifiedVectorFormat *)(ulong)*(uint *)(pFVar2 + (long)pUVar7 * 4);
          }
          local_a2 = *(short *)((long)&((local_78.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               (long)pUVar4 * 2);
          iVar3._M_current = *(short **)(state + 8);
          if (iVar3._M_current == *(short **)(state + 0x10)) {
            std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                      ((vector<short,_std::allocator<short>_> *)state,iVar3,&local_a2);
          }
          else {
            *iVar3._M_current = local_a2;
            *(short **)(state + 8) = iVar3._M_current + 1;
          }
          pUVar7 = pUVar7 + 1;
        } while (local_a0 != pUVar7);
      }
    }
    else if (local_a0 != (UnifiedVectorFormat *)0x0) {
      pFVar2 = ((local_78.input)->bind_data).ptr;
      pUVar7 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar4 = pUVar7;
        if (pFVar2 != (FunctionData *)0x0) {
          pUVar4 = (UnifiedVectorFormat *)(ulong)*(uint *)(pFVar2 + (long)pUVar7 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + ((ulong)pUVar4 >> 6) * 8) >> ((ulong)pUVar4 & 0x3f) & 1
            ) != 0)) {
          local_a2 = *(short *)((long)&((local_78.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               (long)pUVar4 * 2);
          iVar3._M_current = *(short **)(state + 8);
          if (iVar3._M_current == *(short **)(state + 0x10)) {
            std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                      ((vector<short,_std::allocator<short>_> *)state,iVar3,&local_a2);
          }
          else {
            *iVar3._M_current = local_a2;
            *(short **)(state + 8) = iVar3._M_current + 1;
          }
        }
        pUVar7 = pUVar7 + 1;
      } while (local_a0 != pUVar7);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}